

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::Zero(Tensor *d)

{
  float in_stack_0000000c;
  Tensor *in_stack_00000010;
  
  Constant(in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

void TensorTools::Zero(Tensor& d) {
  Constant(d, 0);
}